

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadQuaternion(OgreBinarySerializer *this,aiQuaternion *quat)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  pfVar1 = (float *)this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,(int8_t *)(pfVar1 + 4));
  fVar2 = *pfVar1;
  fVar3 = pfVar1[1];
  fVar4 = pfVar1[2];
  quat->w = pfVar1[3];
  quat->x = fVar2;
  quat->y = fVar3;
  quat->z = fVar4;
  return;
}

Assistant:

void OgreBinarySerializer::ReadQuaternion(aiQuaternion &quat)
{
    float temp[4];
    m_reader->CopyAndAdvance(temp, sizeof(float)*4);
    quat.x = temp[0];
    quat.y = temp[1];
    quat.z = temp[2];
    quat.w = temp[3];
}